

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void deqp::gls::FboUtil::logImage(Image *img,TestLog *log,bool useType)

{
  GLenum value;
  char *pcVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  value = (img->internalFormat).unsizedType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Internal format",&local_62);
  pcVar1 = glu::getTextureFormatName((img->internalFormat).format);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
  logField(log,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (value != 0 && useType) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Format type",&local_62);
    pcVar1 = glu::getTypeName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
    logField(log,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Width",&local_62);
  de::toString<int>(&local_60,&img->width);
  logField(log,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Height",&local_62);
  de::toString<int>(&local_60,&img->height);
  logField(log,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void logImage (const Image& img, TestLog& log, bool useType)
{
	const GLenum type = img.internalFormat.unsizedType;
	logField(log, "Internal format",	getTextureFormatName(img.internalFormat.format));
	if (useType && type != GL_NONE)
		logField(log, "Format type",	getTypeName(type));
	logField(log, "Width",				toString(img.width));
	logField(log, "Height",				toString(img.height));
}